

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O1

void __thiscall ConfusableMatcher::Free(ConfusableMatcher *this)

{
  char *pcVar1;
  vector<CMString,_std::allocator<CMString>_> *pvVar2;
  dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *pdVar3;
  pointer __ptr;
  ConfusableMatcher *pCVar4;
  long lVar5;
  pointer pCVar6;
  pointer ppVar7;
  int x;
  iterator valMapIt;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_70;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_58;
  ConfusableMatcher *local_40;
  long local_38;
  
  lVar5 = 0;
  local_40 = this;
  do {
    ppVar7 = this->TheMap[lVar5].
             super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = lVar5;
    if (ppVar7 != this->TheMap[lVar5].
                  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar1 = (ppVar7->first).Str;
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
        local_58.ht = &ppVar7->second->rep;
        local_58.pos = (local_58.ht)->table;
        local_58.end = local_58.pos + (local_58.ht)->num_buckets;
        google::
        dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::advance_past_empty_and_deleted(&local_58);
        while( true ) {
          local_70.ht = &ppVar7->second->rep;
          local_70.pos = (local_70.ht)->table + (local_70.ht)->num_buckets;
          local_70.end = local_70.pos;
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::advance_past_empty_and_deleted(&local_70);
          if (local_58.pos == local_70.pos) break;
          for (pCVar6 = ((local_58.pos)->second->
                        super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                        super__Vector_impl_data._M_start; pvVar2 = (local_58.pos)->second,
              pCVar6 != (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                        super__Vector_impl_data._M_finish; pCVar6 = pCVar6 + 1) {
            if (pCVar6->Str != (char *)0x0) {
              operator_delete__(pCVar6->Str);
            }
          }
          if (pvVar2 != (vector<CMString,_std::allocator<CMString>_> *)0x0) {
            pCVar6 = (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (pCVar6 != (pointer)0x0) {
              operator_delete(pCVar6,(long)(pvVar2->
                                           super__Vector_base<CMString,_std::allocator<CMString>_>).
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pCVar6);
            }
            operator_delete(pvVar2,0x18);
          }
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::operator++(&local_58);
        }
        pdVar3 = ppVar7->second;
        if (pdVar3 != (dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                       *)0x0) {
          __ptr = (pdVar3->rep).table;
          if (__ptr != (pointer)0x0) {
            free(__ptr);
          }
          operator_delete(pdVar3,0x58);
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != this->TheMap[lVar5].
                         super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pCVar4 = local_40;
    lVar5 = local_38 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    pvVar2 = pCVar4->SkipSet[lVar5];
    if (pvVar2 != (vector<CMString,_std::allocator<CMString>_> *)0x0) {
      for (pCVar6 = (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                    super__Vector_impl_data._M_start; pvVar2 = pCVar4->SkipSet[lVar5],
          pCVar6 != (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pCVar6 = pCVar6 + 1) {
        if (pCVar6->Str != (char *)0x0) {
          operator_delete__(pCVar6->Str);
        }
      }
      if (pvVar2 != (vector<CMString,_std::allocator<CMString>_> *)0x0) {
        pCVar6 = (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pCVar6 != (pointer)0x0) {
          operator_delete(pCVar6,(long)(pvVar2->
                                       super__Vector_base<CMString,_std::allocator<CMString>_>).
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pCVar6);
        }
        operator_delete(pvVar2,0x18);
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

void ConfusableMatcher::Free()
{
	for (auto x = 0;x < std::extent<decltype(TheMap)>::value;x++) {
		for (auto keyArrayIt = TheMap[x].begin();keyArrayIt != TheMap[x].end();keyArrayIt++) {
			keyArrayIt->first.Free();
			for (auto valMapIt = keyArrayIt->second->begin();valMapIt != keyArrayIt->second->end();valMapIt++) {
				for (auto valArrayIt = valMapIt->second->begin();valArrayIt != valMapIt->second->end();valArrayIt++)
					valArrayIt->Free();

				delete valMapIt->second;
			}
			delete keyArrayIt->second;
		}
	}

	for (auto x = 0;x < std::extent<decltype(SkipSet)>::value;x++) {
		if (SkipSet[x] == nullptr)
			continue;

		for (auto it2 = SkipSet[x]->begin();it2 != SkipSet[x]->end();it2++)
			it2->Free();

		delete SkipSet[x];
	}
}